

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)13>_> *
vkt::tessellation::makeImageView
          (Move<vk::Handle<(vk::HandleType)13>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice vkDevice,VkImage image,VkImageViewType viewType,VkFormat format,
          VkImageSubresourceRange subresourceRange)

{
  VkImageViewCreateInfo local_58;
  
  local_58.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  local_58.pNext = (void *)0x0;
  local_58.flags = 0;
  local_58.components.r = VK_COMPONENT_SWIZZLE_R;
  local_58.components.g = VK_COMPONENT_SWIZZLE_G;
  local_58.components.b = VK_COMPONENT_SWIZZLE_B;
  local_58.components.a = VK_COMPONENT_SWIZZLE_A;
  local_58.subresourceRange.aspectMask = subresourceRange.aspectMask;
  local_58.subresourceRange.baseMipLevel = subresourceRange.baseMipLevel;
  local_58.subresourceRange.levelCount = subresourceRange.levelCount;
  local_58.subresourceRange.baseArrayLayer = subresourceRange.baseArrayLayer;
  local_58.subresourceRange.layerCount = subresourceRange.layerCount;
  local_58.image.m_internal = image.m_internal;
  local_58.viewType = viewType;
  local_58.format = format;
  ::vk::createImageView(__return_storage_ptr__,vk,vkDevice,&local_58,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImageView> makeImageView (const DeviceInterface&			vk,
								 const VkDevice					vkDevice,
								 const VkImage					image,
								 const VkImageViewType			viewType,
								 const VkFormat					format,
								 const VkImageSubresourceRange	subresourceRange)
{
	const VkImageViewCreateInfo imageViewParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,		// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		(VkImageViewCreateFlags)0,						// VkImageViewCreateFlags	flags;
		image,											// VkImage					image;
		viewType,										// VkImageViewType			viewType;
		format,											// VkFormat					format;
		makeComponentMappingRGBA(),						// VkComponentMapping		components;
		subresourceRange,								// VkImageSubresourceRange	subresourceRange;
	};
	return createImageView(vk, vkDevice, &imageViewParams);
}